

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

Am_Value __thiscall Am_Value_List::Assoc_1(Am_Value_List *this,Am_Value *value_2)

{
  bool bVar1;
  Am_Assoc_Data *pAVar2;
  Am_Value *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Method_Wrapper *pAVar3;
  Am_Value *initial;
  Am_Value AVar4;
  
  initial = &Am_No_Value;
  if (*(long *)value_2 != 0) {
    for (pAVar3 = (Am_Method_Wrapper *)(*(long *)value_2 + 0x10);
        pAVar3 = (Am_Method_Wrapper *)(pAVar3->super_Am_Registered_Type)._vptr_Am_Registered_Type,
        pAVar3 != (Am_Method_Wrapper *)0x0; pAVar3 = pAVar3 + 1) {
      pAVar2 = Am_Assoc_Data::Narrow((Am_Wrapper *)pAVar3->Call);
      bVar1 = Am_Value::operator==(&pAVar2->value_2,in_RDX);
      if (bVar1) {
        (value_2->value).method_value = pAVar3;
        initial = &pAVar2->value_1;
        break;
      }
    }
  }
  Am_Value::Am_Value((Am_Value *)this,initial);
  AVar4.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

Am_Value
Am_Value_List::Assoc_1(const Am_Value &value_2)
{
  if (!data)
    return Am_No_Value;
  Am_List_Item *this_item = data->head;
  Am_Assoc_Data *assoc;
  while (this_item) {
    assoc = Am_Assoc_Data::Narrow(this_item->value.wrapper_value);
    if (assoc->value_2 == value_2) {
      item = this_item; //move pointer to found item
      return assoc->value_1;
    }
    this_item = this_item->next;
  }
  return Am_No_Value;
}